

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O2

void miniminer_tests::miniminer_1p1c_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_708;
  pointer local_700;
  char *local_6f8;
  char *local_6f0;
  pointer local_6e8;
  pointer local_6e0;
  char *local_6d8;
  char *local_6d0;
  pointer local_6c8;
  pointer local_6c0;
  char *local_6b8;
  char *local_6b0;
  pointer local_6a8;
  pointer local_6a0;
  char *local_698;
  char *local_690;
  pointer local_688;
  pointer local_680;
  char *local_678;
  char *local_670;
  basic_wrap_stringstream<char> local_668;
  miniminer_1p1c t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_670 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"miniminer_1p1c");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_688 = (pbVar3->_M_dataplus)._M_p;
  local_680 = local_688 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x6d;
  file.m_begin = (iterator)&local_678;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_688,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  miniminer_1p1c::miniminer_1p1c(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_690 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"miniminer_1p1c");
  std::operator<<((ostream *)&local_668,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_6a8 = (pbVar3->_M_dataplus)._M_p;
  local_6a0 = local_6a8 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x6d;
  file_00.m_begin = (iterator)&local_698;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_6a8,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_6b0 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"miniminer_1p1c");
  std::operator<<((ostream *)&local_668,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_6c8 = (pbVar3->_M_dataplus)._M_p;
  local_6c0 = local_6c8 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x6d;
  file_01.m_begin = (iterator)&local_6b8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6c8,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  miniminer_1p1c::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_6d0 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"miniminer_1p1c");
  std::operator<<((ostream *)&local_668,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_6e8 = (pbVar3->_M_dataplus)._M_p;
  local_6e0 = local_6e8 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x6d;
  file_02.m_begin = (iterator)&local_6d8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6e8,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_6f0 = "";
  memset(&local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_668);
  std::operator<<((ostream *)&local_668,'\"');
  std::operator<<((ostream *)&local_668,"miniminer_1p1c");
  std::operator<<((ostream *)&local_668,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_668);
  local_708 = (pbVar3->_M_dataplus)._M_p;
  local_700 = local_708 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x6d;
  file_03.m_begin = (iterator)&local_6f8;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_708,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_668);
  TestChain100Setup::~TestChain100Setup(&t.super_TestChain100Setup);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_1p1c, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create a parent tx0 and child tx1 with normal fees:
    const auto tx0 = make_tx({COutPoint{m_coinbase_txns[0]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx0));
    const auto tx1 = make_tx({COutPoint{tx0->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx1));

    // Create a low-feerate parent tx2 and high-feerate child tx3 (cpfp)
    const auto tx2 = make_tx({COutPoint{m_coinbase_txns[1]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx2));
    const auto tx3 = make_tx({COutPoint{tx2->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx3));

    // Create a parent tx4 and child tx5 where both have low fees
    const auto tx4 = make_tx({COutPoint{m_coinbase_txns[2]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx4));
    const auto tx5 = make_tx({COutPoint{tx4->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const CAmount tx5_delta{CENT/100};
    // Make tx5's modified fee much higher than its base fee. This should cause it to pass
    // the fee-related checks despite being low-feerate.
    pool.PrioritiseTransaction(tx5->GetHash(), tx5_delta);
    const CAmount tx5_mod_fee{low_fee + tx5_delta};

    // Create a high-feerate parent tx6, low-feerate child tx7
    const auto tx6 = make_tx({COutPoint{m_coinbase_txns[3]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx6));
    const auto tx7 = make_tx({COutPoint{tx6->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx7));

    std::vector<COutPoint> all_unspent_outpoints({
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx1->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx3->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx5->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1},
        COutPoint{tx7->GetHash(), 0}
    });
    for (const auto& outpoint : all_unspent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));

    std::vector<COutPoint> all_spent_outpoints({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx6->GetHash(), 0}
    });
    for (const auto& outpoint : all_spent_outpoints) BOOST_CHECK(pool.GetConflictTx(outpoint) != nullptr);

    std::vector<COutPoint> all_parent_outputs({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx6->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1}
    });


    std::vector<CTransactionRef> all_transactions{tx0, tx1, tx2, tx3, tx4, tx5, tx6, tx7};
    struct TxDimensions {
        int32_t vsize; CAmount mod_fee; CFeeRate feerate;
    };
    std::map<uint256, TxDimensions> tx_dims;
    for (const auto& tx : all_transactions) {
        const auto& entry{*Assert(pool.GetEntry(tx->GetHash()))};
        tx_dims.emplace(tx->GetHash(), TxDimensions{entry.GetTxSize(), entry.GetModifiedFee(),
                                              CFeeRate(entry.GetModifiedFee(), entry.GetTxSize())});
    }

    const std::vector<CFeeRate> various_normal_feerates({CFeeRate(0), CFeeRate(500), CFeeRate(999),
                                                         CFeeRate(1000), CFeeRate(2000), CFeeRate(2500),
                                                         CFeeRate(3333), CFeeRate(7800), CFeeRate(11199),
                                                         CFeeRate(23330), CFeeRate(50000), CFeeRate(5*CENT)});

    // All nonexistent entries have a bumpfee of zero, regardless of feerate
    std::vector<COutPoint> nonexistent_outpoints({ COutPoint{Txid::FromUint256(GetRandHash()), 0}, COutPoint{Txid::FromUint256(GetRandHash()), 3} });
    for (const auto& outpoint : nonexistent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));
    for (const auto& feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, nonexistent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK(bump_fees.size() == nonexistent_outpoints.size());
        for (const auto& outpoint: nonexistent_outpoints) {
            auto it = bump_fees.find(outpoint);
            BOOST_CHECK(it != bump_fees.end());
            BOOST_CHECK_EQUAL(it->second, 0);
        }
    }

    // Gather bump fees for all available UTXOs.
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());

        // Check tx0 bumpfee: no other bumper.
        const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
        CAmount bumpfee0 = Find(bump_fees, COutPoint{tx0->GetHash(), 1});
        if (target_feerate <= tx0_dimensions.feerate) {
            BOOST_CHECK_EQUAL(bumpfee0, 0);
        } else {
            // Difference is fee to bump tx0 from current to target feerate.
            BOOST_CHECK_EQUAL(bumpfee0, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
        }

        // Check tx2 bumpfee: assisted by tx3.
        const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
        const TxDimensions& tx3_dimensions = tx_dims.find(tx3->GetHash())->second;
        const CFeeRate tx2_feerate = CFeeRate(tx2_dimensions.mod_fee + tx3_dimensions.mod_fee, tx2_dimensions.vsize + tx3_dimensions.vsize);
        CAmount bumpfee2 = Find(bump_fees, COutPoint{tx2->GetHash(), 1});
        if (target_feerate <= tx2_feerate) {
            // As long as target feerate is below tx3's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee2, 0);
        } else {
            // Difference is fee to bump tx2 from current to target feerate, without tx3.
            BOOST_CHECK_EQUAL(bumpfee2, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
        }

        // If tx5’s modified fees are sufficient for tx4 and tx5 to be picked
        // into the block, our prospective new transaction would not need to
        // bump tx4 when using tx4’s second output. If however even tx5’s
        // modified fee (which essentially indicates "effective feerate") is
        // not sufficient to bump tx4, using the second output of tx4 would
        // require our transaction to bump tx4 from scratch since we evaluate
        // transaction packages per ancestor sets and do not consider multiple
        // children’s fees.
        const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
        const TxDimensions& tx5_dimensions = tx_dims.find(tx5->GetHash())->second;
        const CFeeRate tx4_feerate = CFeeRate(tx4_dimensions.mod_fee + tx5_dimensions.mod_fee, tx4_dimensions.vsize + tx5_dimensions.vsize);
        CAmount bumpfee4 = Find(bump_fees, COutPoint{tx4->GetHash(), 1});
        if (target_feerate <= tx4_feerate) {
            // As long as target feerate is below tx5's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee4, 0);
        } else {
            // Difference is fee to bump tx4 from current to target feerate, without tx5.
            BOOST_CHECK_EQUAL(bumpfee4, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
        }
    }
    // Spent outpoints should usually not be requested as they would not be
    // considered available. However, when they are explicitly requested, we
    // can calculate their bumpfee to facilitate RBF-replacements
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner_all_spent(pool, all_spent_outpoints);
        BOOST_CHECK(mini_miner_all_spent.IsReadyToCalculate());
        auto bump_fees_all_spent = mini_miner_all_spent.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_spent.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_spent.size(), all_spent_outpoints.size());
        node::MiniMiner mini_miner_all_parents(pool, all_parent_outputs);
        BOOST_CHECK(mini_miner_all_parents.IsReadyToCalculate());
        auto bump_fees_all_parents = mini_miner_all_parents.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_parents.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_parents.size(), all_parent_outputs.size());
        for (auto& bump_fees : {bump_fees_all_parents, bump_fees_all_spent}) {
            // For all_parents case, both outputs from the parent should have the same bump fee,
            // even though only one of them is in a to-be-replaced transaction.
            BOOST_CHECK(sanity_check(all_transactions, bump_fees));

            // Check tx0 bumpfee: no other bumper.
            const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
            CAmount it0_spent = Find(bump_fees, COutPoint{tx0->GetHash(), 0});
            if (target_feerate <= tx0_dimensions.feerate) {
                BOOST_CHECK_EQUAL(it0_spent, 0);
            } else {
                // Difference is fee to bump tx0 from current to target feerate.
                BOOST_CHECK_EQUAL(it0_spent, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
            }

            // Check tx2 bumpfee: no other bumper, because tx3 is to-be-replaced.
            const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
            const CFeeRate tx2_feerate_unbumped = tx2_dimensions.feerate;
            auto it2_spent = Find(bump_fees, COutPoint{tx2->GetHash(), 0});
            if (target_feerate <= tx2_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it2_spent, 0);
            } else {
                // Difference is fee to bump tx2 from current to target feerate, without tx3.
                BOOST_CHECK_EQUAL(it2_spent, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
            }

            // Check tx4 bumpfee: no other bumper, because tx5 is to-be-replaced.
            const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
            const CFeeRate tx4_feerate_unbumped = tx4_dimensions.feerate;
            auto it4_spent = Find(bump_fees, COutPoint{tx4->GetHash(), 0});
            if (target_feerate <= tx4_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it4_spent, 0);
            } else {
                // Difference is fee to bump tx4 from current to target feerate, without tx5.
                BOOST_CHECK_EQUAL(it4_spent, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
            }
        }
    }

    // Check m_inclusion_order for equivalent mempool- and manually-constructed MiniMiners.
    // (We cannot check bump fees in manually-constructed MiniMiners because it doesn't know what
    // outpoints are requested).
    std::vector<node::MiniMinerMempoolEntry> miniminer_info;
    {
        const int32_t tx0_vsize{tx_dims.at(tx0->GetHash()).vsize};
        const int32_t tx1_vsize{tx_dims.at(tx1->GetHash()).vsize};
        const int32_t tx2_vsize{tx_dims.at(tx2->GetHash()).vsize};
        const int32_t tx3_vsize{tx_dims.at(tx3->GetHash()).vsize};
        const int32_t tx4_vsize{tx_dims.at(tx4->GetHash()).vsize};
        const int32_t tx5_vsize{tx_dims.at(tx5->GetHash()).vsize};
        const int32_t tx6_vsize{tx_dims.at(tx6->GetHash()).vsize};
        const int32_t tx7_vsize{tx_dims.at(tx7->GetHash()).vsize};

        miniminer_info.emplace_back(tx0,/*vsize_self=*/tx0_vsize,/*vsize_ancestor=*/tx0_vsize,/*fee_self=*/med_fee,/*fee_ancestor=*/med_fee);
        miniminer_info.emplace_back(tx1,               tx1_vsize,       tx0_vsize + tx1_vsize,             med_fee,               2*med_fee);
        miniminer_info.emplace_back(tx2,               tx2_vsize,                   tx2_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx3,               tx3_vsize,       tx2_vsize + tx3_vsize,            high_fee,      low_fee + high_fee);
        miniminer_info.emplace_back(tx4,               tx4_vsize,                   tx4_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx5,               tx5_vsize,       tx4_vsize + tx5_vsize,         tx5_mod_fee,   low_fee + tx5_mod_fee);
        miniminer_info.emplace_back(tx6,               tx6_vsize,                   tx6_vsize,            high_fee,                high_fee);
        miniminer_info.emplace_back(tx7,               tx7_vsize,       tx6_vsize + tx7_vsize,             low_fee,      high_fee + low_fee);
    }
    std::map<Txid, std::set<Txid>> descendant_caches;
    descendant_caches.emplace(tx0->GetHash(), std::set<Txid>{tx0->GetHash(), tx1->GetHash()});
    descendant_caches.emplace(tx1->GetHash(), std::set<Txid>{tx1->GetHash()});
    descendant_caches.emplace(tx2->GetHash(), std::set<Txid>{tx2->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx3->GetHash(), std::set<Txid>{tx3->GetHash()});
    descendant_caches.emplace(tx4->GetHash(), std::set<Txid>{tx4->GetHash(), tx5->GetHash()});
    descendant_caches.emplace(tx5->GetHash(), std::set<Txid>{tx5->GetHash()});
    descendant_caches.emplace(tx6->GetHash(), std::set<Txid>{tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx7->GetHash(), std::set<Txid>{tx7->GetHash()});

    node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
    // Use unspent outpoints to avoid entries being omitted.
    node::MiniMiner miniminer_pool(pool, all_unspent_outpoints);
    BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
    BOOST_CHECK(miniminer_pool.IsReadyToCalculate());
    for (const auto& sequences : {miniminer_manual.Linearize(), miniminer_pool.Linearize()}) {
        // tx6 is selected first: high feerate with no parents to bump
        BOOST_CHECK_EQUAL(Find(sequences, tx6->GetHash()), 0);

        // tx2 + tx3 CPFP are selected next
        BOOST_CHECK_EQUAL(Find(sequences, tx2->GetHash()), 1);
        BOOST_CHECK_EQUAL(Find(sequences, tx3->GetHash()), 1);

        // tx4 + prioritised tx5 CPFP
        BOOST_CHECK_EQUAL(Find(sequences, tx4->GetHash()), 2);
        BOOST_CHECK_EQUAL(Find(sequences, tx5->GetHash()), 2);

        BOOST_CHECK_EQUAL(Find(sequences, tx0->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx1->GetHash()), 3);


        // tx7 is selected last: low feerate with no children
        BOOST_CHECK_EQUAL(Find(sequences, tx7->GetHash()), 4);
    }
}